

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_racedump(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  FILE *__stream;
  pointer prVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  char buf [4608];
  char local_1238 [4616];
  
  __stream = fopen("../logs/racdump.txt","w");
  pcVar3 = (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
            super__Vector_impl_data._M_start)->name;
  if (pcVar3 != (char *)0x0) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      fprintf(__stream,";%s;%s;%s;%s;",pcVar3,pcVar3,pcVar3,pcVar3);
      fprintf(__stream," %d;",
              (ulong)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7].pc_race);
      lVar5 = 2;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->act + lVar5 * 8 + lVar4 + -0x10);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xc);
      fprintf(__stream," %ld;",uVar6);
      lVar5 = 0;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->aff + lVar5 * 8 + lVar4);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fprintf(__stream," %ld;",uVar6);
      lVar5 = 0;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->off + lVar5 * 8 + lVar4);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fprintf(__stream," %ld;",uVar6);
      lVar5 = 0;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->imm + lVar5 * 8 + lVar4);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fprintf(__stream," %ld;",uVar6);
      lVar5 = 0;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->res + lVar5 * 8 + lVar4);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fprintf(__stream," %ld;",uVar6);
      lVar5 = 0;
      uVar6 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->vuln + lVar5 * 8 + lVar4);
        if (lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          uVar6 = uVar6 | (long)dVar8;
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      fprintf(__stream," %ld;",uVar6);
      uVar6 = 0;
      lVar5 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->form + uVar6 * 8 + lVar4);
        if (lVar1 < 0x1c && lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          lVar5 = lVar5 + (long)dVar8;
          dVar8 = exp2((double)*(long *)((long)(race_table.
                                                super__Vector_base<race_type,_std::allocator<race_type>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->parts +
                                        uVar6 * 8 + lVar4));
          sprintf(local_1238,"(FORM) %d-%d = %ld\n\r",uVar7 & 0xffffffff,uVar6 & 0xffffffff,
                  (long)dVar8);
          send_to_char(local_1238,ch);
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0xf);
      fprintf(__stream," %ld;",lVar5);
      uVar6 = 0;
      lVar5 = 0;
      prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar1 = *(long *)((long)prVar2->parts + uVar6 * 8 + lVar4);
        if (lVar1 < 0x1c && lVar1 != -99) {
          dVar8 = exp2((double)lVar1);
          lVar5 = lVar5 + (long)dVar8;
          dVar8 = exp2((double)*(long *)((long)(race_table.
                                                super__Vector_base<race_type,_std::allocator<race_type>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->parts +
                                        uVar6 * 8 + lVar4));
          sprintf(local_1238,"(PARTS) %d-%d = %ld\n\r",uVar7 & 0xffffffff,uVar6 & 0xffffffff,
                  (long)dVar8);
          send_to_char(local_1238,ch);
          prVar2 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0xf);
      fprintf(__stream," %ld;",lVar5);
      fprintf(__stream," %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n",
              (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7].arms,
              (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7].legs);
      pcVar3 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7 + 1].name;
      lVar4 = lVar4 + 0x2e8;
      uVar7 = uVar7 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  fclose(__stream);
  return;
}

Assistant:

void do_racedump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(RACE_DUMP_FILE, "w");
	int race = 0, i = 0;
	long temp_bit = 0;
	char buf[MSL];

	for (race = 0; race_table[race].name != nullptr; race++)
	{
		fprintf(fp, ";%s;%s;%s;%s;", race_table[race].name, race_table[race].name, race_table[race].name, race_table[race].name);
		fprintf(fp, " %d;", race_table[race].pc_race);

		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].act[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].act[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].aff[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].aff[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].off[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].off[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].imm[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].imm[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].res[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].res[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].vuln[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].vuln[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].form[i] != NO_FLAG && race_table[race].form[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].form[i]);
				sprintf(buf, "(FORM) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].parts[i] != NO_FLAG && race_table[race].parts[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].parts[i]);
				sprintf(buf, "(PARTS) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		fprintf(fp, " %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n", race_table[race].arms, race_table[race].legs);
	}

	fclose(fp);
}